

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  reference pcVar8;
  char *__first;
  size_t sVar9;
  basic_format_specs<char> *specs;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar10;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  int n;
  int size;
  int num_digits;
  char sep;
  string groups;
  allocator<char> *in_stack_fffffffffffffc48;
  locale_ref in_stack_fffffffffffffc50;
  locale_ref in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffccc;
  size_t in_stack_fffffffffffffcd8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffce8;
  int local_304;
  char *local_300;
  int local_2ec;
  basic_string_view<char> local_2e8;
  type local_2d8;
  allocator<char> local_2d1;
  buffer<char> local_2d0 [16];
  format_decimal_result<char_*> local_b8;
  char local_a8 [48];
  undefined8 local_78;
  undefined8 local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int local_5c;
  int local_58;
  int local_54;
  buffer<char> *local_50;
  char local_41 [17];
  buffer<char> *local_30;
  string local_28 [40];
  
  local_30 = in_RDI[1].container;
  grouping<char>(in_stack_fffffffffffffc58);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_50 = in_RDI[1].container;
    local_41[0] = thousands_sep<char>(in_stack_fffffffffffffc50);
    if (local_41[0] == '\0') {
      on_dec((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_41[1] = '\x01';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
    else {
      local_5c = count_digits(*(uint32_t *)&in_RDI[3].container);
      local_58 = local_5c;
      local_54 = local_5c;
      local_68._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_70 = std::__cxx11::string::cend();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc50.locale_,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc48);
        iVar5 = local_5c;
        bVar3 = false;
        if (bVar1) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          bVar3 = false;
          if (*pcVar8 < iVar5) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
            bVar3 = false;
            if ('\0' < *pcVar8) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_68);
              iVar5 = (int)*pcVar8;
              cVar2 = max_value<char>();
              bVar3 = iVar5 != cVar2;
            }
          }
        }
        if (!bVar3) break;
        local_58 = local_58 + 1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        local_5c = local_5c - *pcVar8;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_68);
      }
      local_78 = std::__cxx11::string::cend();
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc50.locale_,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc48);
      if (bVar3) {
        iVar5 = local_5c + -1;
        pcVar7 = (char *)std::__cxx11::string::back();
        local_58 = iVar5 / (int)*pcVar7 + local_58;
      }
      local_b8 = format_decimal<char,unsigned_int>(local_a8,*(uint *)&in_RDI[3].container,local_54);
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_,in_stack_fffffffffffffc48);
      std::allocator<char>::~allocator(&local_2d1);
      local_58 = local_58 + *(int *)&in_RDI[4].container;
      local_2d8 = to_unsigned<int>(local_58);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_,(size_t)in_stack_fffffffffffffc48);
      basic_string_view<char>::basic_string_view(&local_2e8,local_41,1);
      local_2ec = 0;
      local_68._M_current = (char *)std::__cxx11::string::cbegin();
      pcVar7 = buffer<char>::data(local_2d0);
      local_300 = pcVar7 + (long)local_58 + -1;
      local_304 = local_54;
      while (local_304 = local_304 + -1, 0 < local_304) {
        pcVar7 = local_300 + -1;
        *local_300 = local_a8[local_304];
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        local_300 = pcVar7;
        if ('\0' < *pcVar8) {
          local_2ec = local_2ec + 1;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          if (local_2ec % (int)*pcVar8 == 0) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
            cVar2 = *pcVar8;
            cVar4 = max_value<char>();
            if (cVar2 != cVar4) {
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffc58.locale_,
                          (difference_type)in_stack_fffffffffffffc50.locale_);
              in_stack_fffffffffffffce8.container = (buffer<char> *)std::__cxx11::string::cend();
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc50.locale_,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc48);
              if (bVar3) {
                local_2ec = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_68);
              }
              in_stack_fffffffffffffc58.locale_ = &local_2e8;
              in_stack_fffffffffffffc50.locale_ =
                   basic_string_view<char>::data(in_stack_fffffffffffffc58.locale_);
              __first = basic_string_view<char>::data
                                  ((basic_string_view<char> *)in_stack_fffffffffffffc58.locale_);
              basic_string_view<char>::size
                        ((basic_string_view<char> *)in_stack_fffffffffffffc58.locale_);
              sVar9 = basic_string_view<char>::size
                                ((basic_string_view<char> *)in_stack_fffffffffffffc58.locale_);
              make_checked<char>(pcVar7,sVar9);
              std::uninitialized_copy<char_const*,char*>
                        (__first,(char *)in_stack_fffffffffffffc58.locale_,
                         (char *)in_stack_fffffffffffffc50.locale_);
              sVar9 = basic_string_view<char>::size(&local_2e8);
              local_300 = pcVar7 + -sVar9;
            }
          }
        }
      }
      *local_300 = local_a8[0];
      if (*(int *)&in_RDI[4].container != 0) {
        local_300[-1] = '-';
      }
      specs = (basic_format_specs<char> *)buffer<char>::data(local_2d0);
      bVar10.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                     (in_stack_fffffffffffffce8.container,specs,in_stack_fffffffffffffcd8,
                      in_RDI->container,
                      (anon_class_16_2_3f014a30 *)CONCAT44(in_stack_fffffffffffffccc,local_58));
      in_RDI->container = bVar10.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_);
      local_41[1] = '\0';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
  }
  else {
    on_dec((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *)
           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_41[1] = '\x01';
    local_41[2] = '\0';
    local_41[3] = '\0';
    local_41[4] = '\0';
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }